

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

int enhance_weapon_skill(void)

{
  nh_menuitem *pnVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  unsigned_short uVar5;
  ushort uVar6;
  bool bVar7;
  char cVar8;
  boolean bVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  objdescr *poVar14;
  byte bVar15;
  char cVar16;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  int iVar20;
  char *pcVar21;
  char **ppcVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  bool speedy;
  menulist menu;
  int local_270;
  int selected [1];
  char buf [256];
  char local_138 [264];
  
  if (flags.debug == '\0') {
    speedy = false;
  }
  else {
    cVar8 = yn_function("Advance skills without practice?","yn",'n');
    speedy = cVar8 == 'y';
  }
  init_menulist(&menu);
  do {
    menu.icount = 0;
    lVar29 = 0;
    local_270 = 0;
    iVar28 = 0;
    do {
      if (u.weapon_skills[lVar29].skill != '\0') {
        bVar9 = can_advance((int)lVar29,speedy);
        if (bVar9 == '\0') {
          bVar15 = could_advance((int)lVar29);
          iVar28 = iVar28 + (uint)bVar15;
        }
        else {
          local_270 = local_270 + 1;
        }
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 != 0x2a);
    if (iVar28 < 1) {
      iVar26 = 0;
    }
    else {
      pcVar21 = "s";
      if (iVar28 == 1) {
        pcVar21 = "";
      }
      pcVar17 = "if skill slots become available";
      if (u.ulevel < 0x1e) {
        pcVar17 = "when you\'re more experienced";
      }
      sprintf(buf,"(Skill%s flagged by \"*\" may be enhanced %s.)",pcVar21,pcVar17);
      lVar29 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar29 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,buf);
      menu.icount = menu.icount + 1;
      lVar29 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar29 * 0x218);
      }
      lVar29 = (long)menu.icount;
      menu.items[lVar29].accel = '\0';
      menu.items[lVar29].group_accel = '\0';
      menu.items[lVar29].selected = '\0';
      menu.items[lVar29].caption[0] = '\0';
      menu.items[lVar29].id = 0;
      menu.items[lVar29].role = MI_TEXT;
      iVar26 = menu.icount + 1;
      menu.icount = iVar26;
    }
    pcVar21 = "\n\n";
    if (iVar28 + local_270 != 0 && SCARRY4(iVar28,local_270) == iVar28 + local_270 < 0) {
      pcVar21 = "      ";
    }
    lVar29 = 0;
    do {
      sVar3 = skill_ranges[lVar29].first;
      sVar4 = skill_ranges[lVar29].last;
      if (sVar3 <= sVar4) {
        uVar30 = (long)sVar3;
        do {
          if (uVar30 == (long)sVar3) {
            lVar18 = (long)menu.size;
            if (menu.size <= iVar26) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar18 * 0x218);
              iVar26 = menu.icount;
            }
            pnVar1 = menu.items + iVar26;
            pnVar1->id = 0;
            pnVar1->role = MI_HEADING;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,skill_ranges[lVar29].name);
            iVar26 = menu.icount + 1;
            menu.icount = iVar26;
          }
          if (u.weapon_skills[uVar30].skill != '\0') {
            iVar28 = (int)uVar30;
            bVar9 = can_advance(iVar28,speedy);
            pcVar17 = "";
            if (bVar9 == '\0') {
              bVar9 = could_advance(iVar28);
              pcVar17 = "  * ";
              if (bVar9 == '\0') {
                pcVar17 = pcVar21 + 2;
              }
            }
            buf[0] = ' ';
            buf[1] = '\0';
            pcVar12 = eos(buf);
            if ((0x2ffd7bfeUL >> (uVar30 & 0x3f) & 1) == 0) {
              if (uVar30 == 0x25) {
                uVar13 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
                ppcVar22 = barehands_or_martial;
              }
              else {
                uVar13 = (ulong)(uint)-(int)skill_names_indices[uVar30];
                ppcVar22 = odd_skill_names;
              }
              poVar14 = (objdescr *)(ppcVar22 + uVar13);
            }
            else {
              poVar14 = obj_descr + objects[skill_names_indices[uVar30]].oc_name_idx;
            }
            sprintf(pcVar12,"%s%s",pcVar17,poVar14->oc_name);
            uVar10 = skill_crosstrain_bonus(iVar28);
            if ((1 < (int)uVar10) &&
               (u.weapon_skills[uVar30].skill < u.weapon_skills[uVar30].max_skill)) {
              pcVar17 = eos(buf);
              sprintf(pcVar17," (x%d)",(ulong)uVar10);
            }
            pcVar12 = eos(buf);
            bVar15 = u.weapon_skills[uVar30].skill - 1;
            pcVar17 = "Unknown";
            if (bVar15 < 6) {
              pcVar17 = (&PTR_anon_var_dwarf_1507ef_00314308)[bVar15];
            }
            bVar15 = u.weapon_skills[uVar30].max_skill - 1;
            pcVar19 = "Unknown";
            if (bVar15 < 6) {
              pcVar19 = (&PTR_anon_var_dwarf_1507ef_00314308)[bVar15];
            }
            sprintf(pcVar12,"\t[%s\t/ %s]",pcVar17,pcVar19);
            if (u.weapon_skills[uVar30].skill == u.weapon_skills[uVar30].max_skill) {
              pcVar17 = eos(buf);
              pcVar19 = (char *)0x58414d20202009;
              builtin_strncpy(pcVar17,"\t   MAX",8);
            }
            else {
              uVar5 = u.weapon_skills[uVar30].advance;
              pcVar17 = eos(buf);
              if (uVar5 == 0) {
                builtin_strncpy(pcVar17,"\t      ",8);
              }
              else {
                cVar8 = u.weapon_skills[uVar30].skill;
                uVar10 = (uint)cVar8;
                pcVar19 = (char *)(ulong)uVar10;
                uVar13 = 0;
                if ((uVar10 != 0) && (cVar2 = u.weapon_skills[uVar30].max_skill, cVar8 < cVar2)) {
                  uVar6 = u.weapon_skills[uVar30].advance;
                  uVar23 = (uint)uVar6;
                  uVar25 = iVar28 - 0x1e;
                  uVar13 = (ulong)(((int)cVar2 - uVar10) * 100);
                  uVar11 = uVar10 - 2;
                  iVar26 = uVar10 * 0x14;
                  iVar24 = 0;
                  do {
                    uVar10 = uVar11 + 1;
                    iVar27 = 100 << ((byte)uVar10 & 0x1f);
                    if (uVar25 < 7) {
                      iVar27 = (uVar11 + 2) * iVar26;
                    }
                    if ((int)(uint)uVar6 < iVar27) {
                      if (uVar11 == 0xffffffff) {
                        iVar27 = 100;
                        if (uVar25 < 7) {
                          iVar27 = 0x14;
                        }
                        iVar20 = 0;
                      }
                      else {
                        iVar20 = 100 << ((byte)uVar11 & 0x1f);
                        if (uVar25 < 7) {
                          iVar20 = (iVar26 + -0x14) * (uVar11 + 1);
                        }
                        uVar23 = (uint)uVar6 - iVar20;
                        uVar10 = uVar11;
                      }
                      pcVar19 = (char *)(ulong)uVar10;
                      iVar26 = (int)(uVar23 * 100) / (iVar27 - iVar20);
                      if (99 < iVar26) {
                        iVar26 = 100;
                      }
                      uVar13 = (ulong)(uint)(iVar26 - iVar24);
                      break;
                    }
                    iVar24 = iVar24 + -100;
                    uVar10 = (uVar11 - (int)cVar2) + 1;
                    pcVar19 = (char *)(ulong)uVar10;
                    uVar11 = uVar11 + 1;
                    iVar26 = iVar26 + 0x14;
                  } while (uVar10 != 0xfffffffe);
                }
                sprintf(pcVar17,"\t%5d%%",uVar13);
              }
            }
            if (flags.debug != '\0') {
              pcVar17 = eos(buf);
              cVar8 = u.weapon_skills[uVar30].skill;
              uVar10 = (int)cVar8 * (int)cVar8 * 0x14;
              if (6 < iVar28 - 0x1eU) {
                uVar10 = 100 << (cVar8 - 1U & 0x1f);
              }
              pcVar19 = (char *)(ulong)uVar10;
              sprintf(pcVar17,"/%5d(%4d)",(ulong)u.weapon_skills[uVar30].advance,pcVar19);
            }
            bVar9 = could_advance(iVar28);
            if (((bVar9 != '\0') || (bVar9 = can_advance(iVar28,speedy), bVar9 != '\0')) &&
               ((speedy & flags.debug != '\0') == 0)) {
              pcVar17 = eos(buf);
              uVar10 = (uint)u.weapon_skills[uVar30].skill;
              uVar13 = CONCAT71((int7)((ulong)pcVar19 >> 8),(long)uVar30 < 0x1e);
              if (uVar30 != 0x26 && (long)uVar30 >= 0x1e) {
                uVar10 = ((uVar10 + 1 & 0xffff) >> 0xf) + uVar10 + 1 >> 1;
                uVar13 = (ulong)uVar10;
                uVar10 = (uint)(char)uVar10;
              }
              sprintf(pcVar17," (%d to advance)",(ulong)uVar10,uVar13);
            }
            bVar9 = can_advance(iVar28,speedy);
            iVar28 = iVar28 + 1;
            if (bVar9 == '\0') {
              iVar28 = 0;
            }
            lVar18 = (long)menu.size;
            if (menu.size <= menu.icount) {
              menu.size = menu.size * 2;
              menu.items = (nh_menuitem *)realloc(menu.items,lVar18 * 0x218);
            }
            pnVar1 = menu.items + menu.icount;
            pnVar1->id = iVar28;
            pnVar1->role = MI_NORMAL;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,buf);
            iVar26 = menu.icount + 1;
            menu.icount = iVar26;
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != (long)sVar4 + 1U);
      }
      lVar29 = lVar29 + 1;
    } while (lVar29 != 3);
    pcVar21 = "Current skills:";
    if (0 < local_270) {
      pcVar21 = "Pick a skill to advance:";
    }
    strcpy(buf,pcVar21);
    if ((speedy & flags.debug != '\0') == 0) {
      pcVar21 = eos(buf);
      pcVar17 = "s";
      if (u.weapon_slots == 1) {
        pcVar17 = "";
      }
      sprintf(pcVar21,"  (%d slot%s available)",(ulong)(uint)u.weapon_slots,pcVar17);
      iVar26 = menu.icount;
    }
    iVar28 = display_menu(menu.items,iVar26,buf,(uint)(local_270 != 0),selected);
    if (iVar28 == 1) {
      lVar29 = (long)selected[0];
      uVar30 = lVar29 - 1;
      sVar3 = *(short *)(&DAT_002d9bee + lVar29 * 2);
      uVar10 = (uint)uVar30;
      if ((0x2ffd7bfeUL >> (uVar30 & 0x3f) & 1) == 0) {
        if (uVar10 == 0x25) {
          uVar13 = (ulong)(urole.malenum == 0x160 || urole.malenum == 0x165);
          ppcVar22 = barehands_or_martial;
        }
        else {
          uVar13 = (ulong)(uint)-(int)sVar3;
          ppcVar22 = odd_skill_names;
        }
        poVar14 = (objdescr *)(ppcVar22 + uVar13);
      }
      else {
        poVar14 = obj_descr + objects[sVar3].oc_name_idx;
      }
      bVar15 = u.weapon_skills[lVar29 + -1].skill;
      pcVar21 = "Unknown";
      if ((ulong)bVar15 < 6) {
        pcVar21 = (&PTR_anon_var_dwarf_1507ef_00314308)[bVar15];
      }
      bVar7 = 0x1e < selected[0];
      if (uVar10 != 0x26 && bVar7) {
        bVar15 = (byte)((int)(char)bVar15 + (((int)(char)bVar15 + 1U & 0xffff) >> 0xf) + 1 >> 1);
      }
      pcVar12 = "s";
      pcVar17 = "s";
      if ((int)(char)bVar15 == 1) {
        pcVar17 = "";
      }
      if (u.weapon_slots == 1) {
        pcVar12 = "";
      }
      snprintf(local_138,0x100,"Enhance %s to %s for %d slot%s (%d slot%s left)?",poVar14->oc_name,
               pcVar21,(ulong)(uint)(int)(char)bVar15,pcVar17,(ulong)(uint)u.weapon_slots,pcVar12);
      cVar8 = yn_function(local_138,"yn",'n');
      if (cVar8 == 'y') {
        cVar2 = u.weapon_skills[lVar29 + -1].skill;
        cVar16 = cVar2;
        if (uVar10 != 0x26 && bVar7) {
          cVar16 = (char)((int)(short)cVar2 + (((int)(short)cVar2 + 1U & 0xffff) >> 0xf) + 1 >> 1);
        }
        u.weapon_slots = u.weapon_slots - cVar16;
        u.weapon_skills[lVar29 + -1].skill = cVar2 + '\x01';
        lVar18 = (long)u.skills_advanced;
        u.skills_advanced = u.skills_advanced + 1;
        u.skill_record[lVar18] = (byte)uVar30;
        pcVar21 = "most";
        if (u.weapon_skills[lVar29 + -1].skill < u.weapon_skills[lVar29 + -1].max_skill) {
          pcVar21 = "more";
        }
        if ((0x2ffd7bfeUL >> ((byte)uVar30 & 0x3f) & 1) == 0) {
          if (uVar10 == 0x25) {
            poVar14 = (objdescr *)
                      (barehands_or_martial + (urole.malenum == 0x160 || urole.malenum == 0x165));
          }
          else {
            poVar14 = (objdescr *)(odd_skill_names + (uint)-(int)sVar3);
          }
        }
        else {
          poVar14 = obj_descr + objects[sVar3].oc_name_idx;
        }
        pline("You are now %s skilled in %s.",pcVar21,poVar14->oc_name);
        if (((uVar10 & 0xfffffffe) == 0x28) && (find_ac(), uVar10 == 0x28)) {
          encumber_msg();
        }
      }
      iVar28 = 0;
      while (bVar9 = can_advance(iVar28,speedy), bVar9 == '\0') {
        iVar28 = iVar28 + 1;
        if (iVar28 == 0x2a) goto LAB_002860ee;
      }
      iVar28 = 1;
      if (cVar8 == 'y' && speedy == false) {
        pline("You feel you could be more dangerous!");
      }
    }
  } while ((speedy & 0 < iVar28) != 0);
LAB_002860ee:
  free(menu.items);
  return 0;
}

Assistant:

int enhance_weapon_skill(void)
{
    int pass, i, n, crosstrain, id,
	to_advance, eventually_advance, selected[1];
    char buf[BUFSZ];
    const char *prefix;
    struct menulist menu;
    boolean speedy = FALSE;

    if (wizard && yn("Advance skills without practice?") == 'y')
	speedy = TRUE;

    init_menulist(&menu);
    do {
	menu.icount = 0;
	/* count skills that can advance */
	to_advance = eventually_advance = 0;
	for (i = 0; i < P_NUM_SKILLS; i++) {
	    if (P_RESTRICTED(i))
		continue;
	    if (can_advance(i, speedy)) to_advance++;
	    else if (could_advance(i)) eventually_advance++;
	}

	/* start with a legend if any entries will be annotated
	    with "*" below */
	if (eventually_advance > 0) {
	    sprintf(buf,
		    "(Skill%s flagged by \"*\" may be enhanced %s.)",
		    plur(eventually_advance),
		    (u.ulevel < MAXULEV) ?
			"when you're more experienced" :
			"if skill slots become available");
	    add_menutext(&menu, buf);
	    add_menutext(&menu, "");
	}

	/* List the skills, making ones that could be advanced
	    selectable.  List the miscellaneous skills first.
	    Possible future enhancement:  list spell skills before
	    weapon skills for spellcaster roles. */
	for (pass = 0; pass < SIZE(skill_ranges); pass++)
	    for (i = skill_ranges[pass].first;
		i <= skill_ranges[pass].last; i++) {
	    /* Print headings for skill types */
	    if (i == skill_ranges[pass].first)
		add_menuheading(&menu, skill_ranges[pass].name);

	    if (P_RESTRICTED(i))
		continue;
	    /*
	     * The 12 is the longest skill level name.
	     * The "    " is room for a selection letter and dash, "a - ".
	     */
	    if (can_advance(i, speedy))
		prefix = "";	/* will be preceded by menu choice */
	    else if (could_advance(i))
		prefix = "  * ";
	    else
		prefix = (to_advance + eventually_advance > 0) ? "    " : "";
	    strcpy(buf, " ");
	    sprintf(eos(buf), "%s%s", prefix, P_NAME(i));
	    crosstrain = skill_crosstrain_bonus(i);
	    if (crosstrain > 1 && P_SKILL(i) < P_MAX_SKILL(i))
		sprintf(eos(buf), " (x%d)", crosstrain);

	    sprintf(eos(buf), "\t[%s\t/ %s]",
		    skill_level_name(P_SKILL(i)),
		    skill_level_name(P_MAX_SKILL(i)));

	    if (P_SKILL(i) == P_MAX_SKILL(i)) {
		sprintf(eos(buf), "\t   MAX");
	    } else if (P_ADVANCE(i) == 0) {
		sprintf(eos(buf), "\t      ");
	    } else {
		sprintf(eos(buf), "\t%5d%%", skill_training_percent(i));
	    }
	    if (wizard) {
		sprintf(eos(buf), "/%5d(%4d)",
			P_ADVANCE(i), practice_needed_to_advance(i, P_SKILL(i)));
	    }

	    if ((could_advance(i) || can_advance(i, speedy)) && !(wizard && speedy))
		sprintf(eos(buf), " (%d to advance)", slots_required(i));
	    id = can_advance(i, speedy) ? i+1 : 0;
	    add_menuitem(&menu, id, buf, 0, FALSE);
	}

	strcpy(buf, (to_advance > 0) ? "Pick a skill to advance:" :
					"Current skills:");
	if (!(wizard && speedy)) {
	    sprintf(eos(buf), "  (%d slot%s available)",
		    u.weapon_slots, plur(u.weapon_slots));
	}
	n = display_menu(menu.items, menu.icount, buf,
			    to_advance ? PICK_ONE : PICK_NONE, selected);
	if (n == 1) {
	    boolean skill_advanced;
	    n = selected[0] - 1;	/* get item selected */
	    skill_advanced = skill_advance(n);
	    /* check for more skills able to advance, if so then .. */
	    for (n = i = 0; i < P_NUM_SKILLS; i++) {
		if (can_advance(i, speedy)) {
		    if (skill_advanced && !speedy)
			pline("You feel you could be more dangerous!");
		    n++;
		    break;
		}
	    }
	}
    } while (speedy && n > 0);
    
    free(menu.items);
    return 0;
}